

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O3

Gia_Man_t * Cec_ManFraSpecReduction(Cec_ManFra_t *p)

{
  Gia_Rpr_t GVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  undefined4 *__s;
  void *__ptr;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  Cec_ParFra_t *pCVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  
  Gia_ManSetPhase(p->pAig);
  p->vXorNodes->nSize = 0;
  if (p->pPars->nLevelMax != 0) {
    Gia_ManLevelNum(p->pAig);
  }
  p_00 = Gia_ManStart(p->pAig->nObjs);
  pGVar10 = p->pAig;
  pcVar2 = pGVar10->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = pGVar10->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  Gia_ManHashAlloc(p_00);
  pGVar10 = p->pAig;
  sVar7 = (size_t)pGVar10->nObjs;
  __s = (undefined4 *)malloc(sVar7 * 4);
  memset(__s,0xff,sVar7 * 4);
  __ptr = calloc(sVar7,4);
  *__s = 0;
  if (1 < (long)sVar7) {
    lVar18 = 0x100000000;
    uVar16 = 1;
    lVar14 = 0xc;
    do {
      pGVar3 = pGVar10->pObjs;
      uVar11 = *(ulong *)(&pGVar3->field_0x0 + lVar14);
      uVar4 = (uint)uVar11;
      if ((uVar4 & 0x9fffffff) == 0x9fffffff) {
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar11 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar11 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar11 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) {
LAB_0065fa66:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_0065fa66;
        __s[uVar16] = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
      }
      else if ((-1 < (int)uVar4 || (~uVar4 & 0x1fffffff) == 0) &&
              (uVar4 = *(uint *)((long)__s +
                                ((long)((ulong)(uVar4 & 0x1fffffff) * -0x100000000 + lVar18) >> 0x1e
                                )), uVar4 != 0xffffffff)) {
        uVar15 = (uint)(uVar11 >> 0x20);
        uVar13 = *(uint *)((long)__s +
                          ((long)((ulong)(uVar15 & 0x1fffffff) * -0x100000000 + lVar18) >> 0x1e));
        if (uVar13 != 0xffffffff) {
          if (((int)uVar4 < 0) || ((int)uVar13 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar4 = Gia_ManHashAnd(p_00,uVar4 ^ (uint)(uVar11 >> 0x1d) & 1,uVar13 ^ uVar15 >> 0x1d & 1
                                );
          __s[uVar16] = uVar4;
          iVar5 = *(int *)((long)__ptr +
                          ((long)((*(ulong *)(&pGVar3->field_0x0 + lVar14) & 0x1fffffff) *
                                  -0x100000000 + lVar18) >> 0x1e));
          iVar17 = *(int *)((long)__ptr +
                           ((long)((*(ulong *)(&pGVar3->field_0x0 + lVar14) >> 0x20 & 0x1fffffff) *
                                   -0x100000000 + lVar18) >> 0x1e));
          if (iVar17 < iVar5) {
            iVar17 = iVar5;
          }
          *(int *)((long)__ptr + uVar16 * 4) = iVar17;
          GVar1 = p->pAig->pReprs[uVar16];
          uVar11 = (ulong)(uint)GVar1 & 0xfffffff;
          if ((GVar1._3_1_ >> 5 & 1) == 0 && uVar11 != 0xfffffff) {
            if (uVar16 <= uVar11) {
              __assert_fail("Gia_ObjRepr(p->pAig, i) < i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSweep.c"
                            ,0x50,"Gia_Man_t *Cec_ManFraSpecReduction(Cec_ManFra_t *)");
            }
            uVar13 = __s[uVar11];
            if (uVar13 != 0xffffffff) {
              if (((int)uVar4 < 0) || ((int)uVar13 < 0)) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x133,"int Abc_LitRegular(int)");
              }
              if (1 < (uVar13 ^ uVar4)) {
                pCVar12 = p->pPars;
                if (pCVar12->nLevelMax == 0) {
LAB_0065f89e:
                  if (pCVar12->fDualOut == 0) {
                    pGVar10 = p->pAig;
                    uVar15 = (uint)pGVar10->pReprs[uVar16] & 0xfffffff;
LAB_0065f8f1:
                    pGVar9 = Gia_ManObj(pGVar10,uVar15);
                    uVar13 = uVar13 ^ ((uint)(&pGVar3->field_0x0 + lVar14) & 1 ^
                                      (uint)((ulong)*(undefined8 *)
                                                     ((ulong)(&pGVar3->field_0x0 + lVar14) &
                                                     0xfffffffffffffffe) >> 0x3f)) !=
                                      ((uint)pGVar9 & 1 ^
                                      (uint)((ulong)*(undefined8 *)
                                                     ((ulong)pGVar9 & 0xfffffffffffffffe) >> 0x3f));
                    __s[uVar16] = uVar13;
                    if ((p->pAig->pReprs[uVar16].field_0x3 & 0x10) == 0) {
                      iVar5 = Gia_ManHashXor(p_00,uVar4,uVar13);
                      Gia_ManAppendCo(p_00,iVar5);
                      Vec_IntPush(p->vXorNodes,(uint)p->pAig->pReprs[uVar16] & 0xfffffff);
                      Vec_IntPush(p->vXorNodes,(int)uVar16);
                      iVar5 = *(int *)((long)__ptr +
                                      (ulong)((uint)p->pAig->pReprs[uVar16] & 0xfffffff) * 4);
                      if (iVar5 < iVar17) {
                        iVar5 = iVar17;
                      }
                      *(int *)((long)__ptr + uVar16 * 4) = iVar5 + 1;
                      iVar17 = p->pPars->nDepthMax;
                      if ((iVar17 != 0) && (iVar17 <= iVar5 + 1)) {
                        __s[uVar16] = 0xffffffff;
                      }
                    }
                  }
                  else {
                    pGVar10 = p->pAig;
                    GVar1 = pGVar10->pReprs[uVar16];
                    uVar15 = (uint)GVar1 & 0xfffffff;
                    uVar6 = (uint)GVar1 ^ (uint)pGVar10->pReprs[uVar15];
                    if (pCVar12->fColorDiff == 0) {
                      if (0x3fffffff < uVar6) goto LAB_0065f8f1;
                    }
                    else if (0xbfffffff < uVar6) goto LAB_0065f8f1;
                  }
                }
                else {
                  iVar5 = Gia_ObjLevelId((Gia_Man_t *)p->pAig->vLevels,(int)uVar16);
                  if (iVar5 <= p->pPars->nLevelMax) {
                    iVar5 = Gia_ObjLevelId((Gia_Man_t *)p->pAig->vLevels,uVar13 >> 1);
                    pCVar12 = p->pPars;
                    if (iVar5 <= pCVar12->nLevelMax) goto LAB_0065f89e;
                  }
                }
              }
            }
          }
        }
      }
      uVar16 = uVar16 + 1;
      pGVar10 = p->pAig;
      lVar18 = lVar18 + 0x100000000;
      lVar14 = lVar14 + 0xc;
    } while ((long)uVar16 < (long)pGVar10->nObjs);
  }
  free(__s);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,0);
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar10;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs limited speculative reduction.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Cec_ManFraSpecReduction( Cec_ManFra_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr = NULL;
    int iRes0, iRes1, iRepr, iNode, iMiter;
    int i, fCompl, * piCopies, * pDepths;
    Gia_ManSetPhase( p->pAig );
    Vec_IntClear( p->vXorNodes );
    if ( p->pPars->nLevelMax )
        Gia_ManLevelNum( p->pAig );
    pNew = Gia_ManStart( Gia_ManObjNum(p->pAig) );
    pNew->pName = Abc_UtilStrsav( p->pAig->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pAig->pName );
    Gia_ManHashAlloc( pNew );
    piCopies = ABC_FALLOC( int, Gia_ManObjNum(p->pAig) );
    pDepths  = ABC_CALLOC( int, Gia_ManObjNum(p->pAig) );
    piCopies[0] = 0;
    Gia_ManForEachObj1( p->pAig, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) ) 
        {
            piCopies[i] = Gia_ManAppendCi( pNew );
            continue;
        }
        if ( Gia_ObjIsCo(pObj) ) 
            continue;
        if ( piCopies[Gia_ObjFaninId0(pObj,i)] == -1 ||
             piCopies[Gia_ObjFaninId1(pObj,i)] == -1 )
             continue;
        iRes0 = Abc_LitNotCond( piCopies[Gia_ObjFaninId0(pObj,i)], Gia_ObjFaninC0(pObj) );
        iRes1 = Abc_LitNotCond( piCopies[Gia_ObjFaninId1(pObj,i)], Gia_ObjFaninC1(pObj) );
        iNode = piCopies[i] = Gia_ManHashAnd( pNew, iRes0, iRes1 );
        pDepths[i] = Abc_MaxInt( pDepths[Gia_ObjFaninId0(pObj,i)], pDepths[Gia_ObjFaninId1(pObj,i)] );
        if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID || Gia_ObjFailed(p->pAig, i) )
            continue;
        assert( Gia_ObjRepr(p->pAig, i) < i );
        iRepr = piCopies[Gia_ObjRepr(p->pAig, i)];
        if ( iRepr == -1 )
            continue;
        if ( Abc_LitRegular(iNode) == Abc_LitRegular(iRepr) )
            continue;
        if ( p->pPars->nLevelMax && 
            (Gia_ObjLevelId(p->pAig, i)  > p->pPars->nLevelMax || 
             Gia_ObjLevelId(p->pAig, Abc_Lit2Var(iRepr)) > p->pPars->nLevelMax) )
            continue;
        if ( p->pPars->fDualOut )
        {
//            if ( i % 1000 == 0 && Gia_ObjRepr(p->pAig, i) )
//                Gia_ManEquivPrintOne( p->pAig, Gia_ObjRepr(p->pAig, i), 0 );
            if ( p->pPars->fColorDiff )
            {
                if ( !Gia_ObjDiffColors( p->pAig, Gia_ObjRepr(p->pAig, i), i ) )
                    continue;
            }
            else
            {
                if ( !Gia_ObjDiffColors2( p->pAig, Gia_ObjRepr(p->pAig, i), i ) )
                    continue;
            }
        }
        pRepr = Gia_ManObj( p->pAig, Gia_ObjRepr(p->pAig, i) );
        fCompl = Gia_ObjPhaseReal(pObj) ^ Gia_ObjPhaseReal(pRepr);
        piCopies[i] = Abc_LitNotCond( iRepr, fCompl );
        if ( Gia_ObjProved(p->pAig, i) )
            continue;
        // produce speculative miter
        iMiter = Gia_ManHashXor( pNew, iNode, piCopies[i] );
        Gia_ManAppendCo( pNew, iMiter );
        Vec_IntPush( p->vXorNodes, Gia_ObjRepr(p->pAig, i) );
        Vec_IntPush( p->vXorNodes, i );
        // add to the depth of this node
        pDepths[i] = 1 + Abc_MaxInt( pDepths[i], pDepths[Gia_ObjRepr(p->pAig, i)] );
        if ( p->pPars->nDepthMax && pDepths[i] >= p->pPars->nDepthMax )
            piCopies[i] = -1;
    }
    ABC_FREE( piCopies );
    ABC_FREE( pDepths );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}